

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char cVar1;
  size_t __n;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  int iVar5;
  size_type sVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  char cVar7;
  bool bVar8;
  bool bVar9;
  iterator iter;
  const_iterator local_128;
  iterator local_120;
  path local_d8;
  undefined1 local_b8 [32];
  const_iterator local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  path local_70;
  path local_50;
  
  cVar7 = (char)this;
  if ((p->_path)._M_string_length == 0) {
    sVar6 = (this->_path)._M_string_length;
    if (sVar6 == 0) {
      return this;
    }
    cVar1 = (this->_path)._M_dataplus._M_p[sVar6 - 1];
    if (cVar1 == '/') {
      return this;
    }
    if (cVar1 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar7);
    return this;
  }
  sVar6 = root_name_length(p);
  if (sVar6 < (p->_path)._M_string_length) {
    bVar8 = (p->_path)._M_dataplus._M_p[sVar6] == '/';
  }
  else {
    bVar8 = false;
  }
  if (bVar8) {
    root_name(&local_70,this);
    __n = (this->_path)._M_string_length;
    if ((__n != local_70._path._M_string_length) ||
       (((__n != 0 &&
         (iVar5 = bcmp((this->_path)._M_dataplus._M_p,local_70._path._M_dataplus._M_p,__n),
         iVar5 != 0)) || (iVar5 = std::__cxx11::string::compare((char *)p), iVar5 != 0)))) {
      bVar2 = false;
      bVar9 = true;
      bVar8 = true;
      goto LAB_001d49bd;
    }
  }
  sVar6 = root_name_length(p);
  if (sVar6 == 0) {
    bVar2 = false;
    bVar9 = false;
  }
  else {
    root_name(&local_d8,p);
    root_name(&local_50,this);
    iVar5 = compare(&local_d8,&local_50);
    bVar9 = iVar5 != 0;
    bVar2 = true;
  }
LAB_001d49bd:
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
      operator_delete(local_50._path._M_dataplus._M_p,
                      local_50._path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._path._M_dataplus._M_p != &local_d8._path.field_2) {
      operator_delete(local_d8._path._M_dataplus._M_p,
                      local_d8._path.field_2._M_allocated_capacity + 1);
    }
  }
  if ((bVar8) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._path._M_dataplus._M_p != &local_70._path.field_2)) {
    operator_delete(local_70._path._M_dataplus._M_p,local_70._path.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar9) {
    sVar6 = root_name_length(p);
    if ((sVar6 < (p->_path)._M_string_length) && ((p->_path)._M_dataplus._M_p[sVar6] == '/')) {
      root_name((path *)local_b8,this);
      std::__cxx11::string::_M_assign((string *)this);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
    }
    else {
      sVar6 = root_name_length(this);
      if (((((this->_path)._M_string_length <= sVar6) ||
           ((this->_path)._M_dataplus._M_p[sVar6] != '/')) &&
          ((sVar6 = root_name_length(this), sVar6 < (this->_path)._M_string_length &&
           ((this->_path)._M_dataplus._M_p[sVar6] == '/')))) || (bVar8 = has_filename(this), bVar8))
      {
        std::__cxx11::string::push_back(cVar7);
      }
    }
    local_120._first._M_current = (p->_path)._M_dataplus._M_p;
    iterator::iterator((iterator *)local_b8,p,&local_120._first);
    sVar6 = root_name_length(p);
    if (sVar6 != 0) {
      iterator::operator++((iterator *)local_b8);
    }
    bVar8 = true;
    while( true ) {
      local_128._M_current = (p->_path)._M_dataplus._M_p + (p->_path)._M_string_length;
      iterator::iterator(&local_120,p,&local_128);
      cVar4._M_current = local_98._M_current;
      cVar3._M_current = local_120._iter._M_current;
      iVar5 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._current._path._M_dataplus._M_p != &local_120._current._path.field_2) {
        operator_delete(local_120._current._path._M_dataplus._M_p,
                        local_120._current._path.field_2._M_allocated_capacity + 1);
        iVar5 = extraout_EDX_00;
      }
      if (cVar4._M_current == cVar3._M_current) break;
      if ((!bVar8) &&
         ((sVar6 = (this->_path)._M_string_length, sVar6 == 0 ||
          ((this->_path)._M_dataplus._M_p[sVar6 - 1] != '/')))) {
        std::__cxx11::string::push_back(cVar7);
        iVar5 = extraout_EDX_01;
      }
      iterator::operator++(&local_120,(iterator *)local_b8,iVar5);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_120._current._path._M_dataplus._M_p)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._current._path._M_dataplus._M_p != &local_120._current._path.field_2) {
        operator_delete(local_120._current._path._M_dataplus._M_p,
                        local_120._current._path.field_2._M_allocated_capacity + 1);
      }
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    return this;
  }
  std::__cxx11::string::_M_assign((string *)this);
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != preferred_separator && _path[_path.length() - 1] != ':') {
            _path += preferred_separator;
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name()._path || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += preferred_separator;
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == preferred_separator)) {
            _path += preferred_separator;
        }
        first = false;
        _path += (*iter++).native();
    }
    check_long_path();
    return *this;
}